

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall CTcTokenizer::skip_delimited_group(CTcTokenizer *this,utf8_ptr *p,int parts_to_skip)

{
  byte bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  int parts_to_skip_00;
  
  wVar2 = utf8_ptr::s_getch(p->p_);
  if ((wVar2 & 0xfffffffbU) != 0) {
    bVar1 = *p->p_;
    p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
    do {
      if (parts_to_skip == 0) {
        return;
      }
      wVar3 = utf8_ptr::s_getch(p->p_);
      if ((wVar3 & 0xfffffffbU) != 0) {
        if (wVar3 == wVar2) {
          parts_to_skip = parts_to_skip + -1;
LAB_00224bd4:
          bVar1 = *p->p_;
          p->p_ = p->p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
        }
        else {
          if (wVar3 == L'\x05') {
            parts_to_skip_00 = 2;
          }
          else {
            if (1 < (uint)(wVar3 + L'\xfffffff9')) goto LAB_00224bd4;
            parts_to_skip_00 = 1;
          }
          skip_delimited_group(this,p,parts_to_skip_00);
        }
      }
    } while ((wVar3 & 0xfffffffbU) != 0);
  }
  return;
}

Assistant:

void CTcTokenizer::skip_delimited_group(utf8_ptr *p, int parts_to_skip)
{
    wchar_t delim;

    /* get the delimiter character */
    delim = p->getch();

    /* 
     *   if the delimiter put us at the end of the line, there's nothing to
     *   skip 
     */
    if (delim == 0 || delim == TOK_END_PP_LINE)
        return;

    /* skip the delimiter */
    p->inc();

    /* keep going until we've skipped the desired number of parts */
    while (parts_to_skip != 0)
    {
        wchar_t ch;

        /* read the next character */
        ch = p->getch();

        /* if it's the end of the line, give up */
        if (ch == 0 || ch == TOK_END_PP_LINE)
        {
            /* 
             *   we ran out of input before reaching the delimiter, so this
             *   is implicitly the end of it 
             */
            return;
        }

        /* check what we have */
        if (ch == delim)
        {
            /* that's one less part to skip */
            --parts_to_skip;

            /* skip it */
            p->inc();
        }
        else if (ch == TOK_MACRO_FOREACH_FLAG)
        {
            /* it's a nested #foreach - skip all of its parts */
            skip_delimited_group(p, 2);
        }
        else if (ch == TOK_MACRO_IFEMPTY_FLAG
                 || ch == TOK_MACRO_IFNEMPTY_FLAG)
        {
            /* nested #ifempty or #ifnempty - skip its expansion */
            skip_delimited_group(p, 1);
        }
        else
        {
            /* it's nothing special to us - skip it */
            p->inc();
        }
    }
}